

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operhlp.c
# Opt level: O2

CURLcode get_url_file_name(char **filename,char *url)

{
  CURLcode CVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  *filename = (char *)0x0;
  pcVar2 = strstr(url,"://");
  pcVar4 = pcVar2 + 3;
  if (pcVar2 == (char *)0x0) {
    pcVar4 = url;
  }
  pcVar2 = strrchr(pcVar4,0x5c);
  pcVar3 = strrchr(pcVar4,0x2f);
  pcVar4 = pcVar3;
  if (pcVar3 < pcVar2) {
    pcVar4 = pcVar2;
  }
  if (pcVar3 == (char *)0x0) {
    pcVar4 = pcVar2;
  }
  if (pcVar2 == (char *)0x0) {
    pcVar4 = pcVar3;
  }
  pcVar2 = "";
  if (pcVar4 != (char *)0x0) {
    pcVar2 = pcVar4 + 1;
  }
  pcVar4 = strdup(pcVar2);
  *filename = pcVar4;
  CVar1 = CURLE_OUT_OF_MEMORY;
  if (pcVar4 != (char *)0x0) {
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

CURLcode get_url_file_name(char **filename, const char *url)
{
  const char *pc, *pc2;

  *filename = NULL;

  /* Find and get the remote file name */
  pc = strstr(url, "://");
  if(pc)
    pc += 3;
  else
    pc = url;

  pc2 = strrchr(pc, '\\');
  pc = strrchr(pc, '/');
  if(pc2 && (!pc || pc < pc2))
    pc = pc2;

  if(pc)
    /* duplicate the string beyond the slash */
    pc++;
  else
    /* no slash => empty string */
    pc = "";

  *filename = strdup(pc);
  if(!*filename)
    return CURLE_OUT_OF_MEMORY;

#if defined(MSDOS) || defined(WIN32)
  {
    char *sanitized;
    SANITIZEcode sc = sanitize_file_name(&sanitized, *filename, 0);
    Curl_safefree(*filename);
    if(sc)
      return CURLE_URL_MALFORMAT;
    *filename = sanitized;
  }
#endif /* MSDOS || WIN32 */

  /* in case we built debug enabled, we allow an environment variable
   * named CURL_TESTDIR to prefix the given file name to put it into a
   * specific directory
   */
#ifdef DEBUGBUILD
  {
    char *tdir = curlx_getenv("CURL_TESTDIR");
    if(tdir) {
      char buffer[512]; /* suitably large */
      snprintf(buffer, sizeof(buffer), "%s/%s", tdir, *filename);
      Curl_safefree(*filename);
      *filename = strdup(buffer); /* clone the buffer */
      curl_free(tdir);
      if(!*filename)
        return CURLE_OUT_OF_MEMORY;
    }
  }
#endif

  return CURLE_OK;
}